

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::
DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  Entry *res;
  Entry *pEVar6;
  Exception *this_00;
  Entry *pEVar7;
  ulong uVar8;
  pointer *__ptr;
  default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *this_01;
  void **head;
  long lVar9;
  Set<Kernel::Term_*,_Lib::DefaultHash> *local_40;
  long local_38;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar9 = (long)iVar1;
  if (lVar9 == 0) {
    pEVar6 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    uVar8 = lVar9 << 4;
    if (uVar8 < 0x11) {
      pEVar6 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      pEVar6 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                  ((FixedSizeAllocator<24UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      pEVar6 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      pEVar6 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      pEVar6 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                  ((FixedSizeAllocator<64UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pEVar6 = (Entry *)::operator_new(uVar8,0x10);
    }
  }
  pEVar4 = this->_entries;
  pEVar5 = this->_afterLast;
  uVar2 = this->_timestamp;
  local_38 = (long)this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar3 = this->_capacityIndex;
  this->_capacityIndex = iVar3 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar3 * 4 + 4);
  pEVar7 = pEVar6;
  if (iVar1 != 0) {
    do {
      (pEVar7->field_0)._infoData = 0;
      (pEVar7->_val)._M_t.
      super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl =
           (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
      lVar9 = lVar9 + -1;
      pEVar7 = pEVar7 + 1;
    } while (lVar9 != 0);
  }
  this->_entries = pEVar6;
  this->_afterLast = pEVar6 + this->_capacity;
  if (pEVar4 != pEVar5) {
    this_01 = (default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)&pEVar4->_val;
    do {
      if ((*(uint *)(this_01 + -8) & 1) == 0 && *(uint *)(this_01 + -8) >> 2 == uVar2) {
        local_40 = *(Set<Kernel::Term_*,_Lib::DefaultHash> **)this_01;
        *(undefined8 *)this_01 = 0;
        insert(this,*(uint *)(this_01 + -4),
               (unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                *)&local_40);
        if (local_40 != (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
          std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                    ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)&local_40,
                     local_40);
        }
        local_40 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
      }
      if (*(Set<Kernel::Term_*,_Lib::DefaultHash> **)this_01 !=
          (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
        std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                  (this_01,*(Set<Kernel::Term_*,_Lib::DefaultHash> **)this_01);
      }
      *(undefined8 *)this_01 = 0;
      pEVar6 = (Entry *)(this_01 + 8);
      this_01 = this_01 + 0x10;
    } while (pEVar6 != pEVar5);
  }
  if (((int)local_38 != 0) && (pEVar4 != (Entry *)0x0)) {
    uVar8 = local_38 << 4;
    if (uVar8 < 0x11) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar4;
    }
    else if (uVar8 < 0x19) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar4;
    }
    else if (uVar8 < 0x21) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar4;
    }
    else if (uVar8 < 0x31) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar4;
    }
    else if (uVar8 < 0x41) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar4;
    }
    else {
      operator_delete(pEVar4,0x10);
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }